

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O2

VkFramebuffer __thiscall
Diligent::FramebufferCache::GetFramebuffer
          (FramebufferCache *this,FramebufferCacheKey *Key,uint32_t width,uint32_t height,
          uint32_t layers)

{
  uint uVar1;
  VkImageView pVVar2;
  uint uVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  Uint32 rt_1;
  FramebufferCacheKey *pFVar7;
  string *psVar8;
  VkImageView *ppVVar9;
  VkFramebuffer pVVar10;
  byte bVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>,_bool>
  pVar12;
  FramebufferWrapper Framebuffer;
  VkFramebufferCreateInfo local_148;
  array<VkImageView_T_*,_10UL> Attachments;
  string msg;
  VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13> local_48;
  
  bVar11 = 0;
  std::mutex::lock(&this->m_Mutex);
  iVar4 = std::
          _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,_std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_Cache)._M_h,Key);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_148.pNext = (void *)0x0;
    local_148.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
    local_148._4_4_ = 0;
    local_148.flags = 0;
    local_148._20_4_ = 0;
    local_148.renderPass = Key->Pass;
    pVVar2 = Key->DSV;
    if (pVVar2 != (VkImageView)0x0) {
      Attachments._M_elems[0] = pVVar2;
    }
    uVar3 = (uint)(pVVar2 != (VkImageView)0x0);
    uVar1 = Key->NumRenderTargets;
    ppVVar9 = Key->RTVs;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (Key->RTVs[uVar6] != (VkImageView_T *)0x0) {
        Attachments._M_elems[uVar3] = Key->RTVs[uVar6];
        uVar3 = uVar3 + 1;
      }
    }
    local_148.attachmentCount = uVar3;
    if (Key->ShadingRate != (VkImageView_T *)0x0) {
      local_148.attachmentCount = uVar3 + 1;
      Attachments._M_elems[uVar3] = Key->ShadingRate;
    }
    local_148._36_4_ = 0;
    local_148.pAttachments = Attachments._M_elems;
    local_148.height = height;
    local_148.width = width;
    local_148._60_4_ = 0;
    local_148.layers = layers;
    VulkanUtilities::VulkanLogicalDevice::CreateFramebuffer
              (&Framebuffer,
               (this->m_DeviceVk->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_148,"");
    pVVar10 = Framebuffer.m_VkObject;
    pFVar7 = Key;
    psVar8 = &msg;
    for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
      (psVar8->_M_dataplus)._M_p = (pointer)pFVar7->Pass;
      pFVar7 = (FramebufferCacheKey *)((long)pFVar7 + (ulong)bVar11 * -0x10 + 8);
      psVar8 = (string *)((long)psVar8 + (ulong)bVar11 * -0x10 + 8);
    }
    local_48.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = Framebuffer.m_pLogicalDevice.
             super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_48.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         Framebuffer.m_pLogicalDevice.
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    Framebuffer.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    Framebuffer.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48.m_VkObject = Framebuffer.m_VkObject;
    Framebuffer.m_VkObject = (VkFramebuffer_T *)0x0;
    pVar12 = std::
             _Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>,std::__detail::_Select1st,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::
             _M_emplace<std::pair<Diligent::FramebufferCache::FramebufferCacheKey,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>
                       ((_Hashtable<Diligent::FramebufferCache::FramebufferCacheKey,std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>,std::__detail::_Select1st,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)&this->m_Cache,&msg);
    VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>
    ::~VulkanObjectWrapper(&local_48);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[46]>(&msg,(char (*) [46])"New framebuffer must be inserted into the map");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
                 ,0x7c);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    _Hashtable<VkRenderPass_T*,std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkRenderPass_T*>,std::hash<VkRenderPass_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<VkRenderPass_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
              ((_Hashtable<VkRenderPass_T*,std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkRenderPass_T*>,std::hash<VkRenderPass_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&this->m_RenderPassToKeyMap,Key,Key);
    if (Key->DSV != (VkImageView)0x0) {
      std::
      _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&this->m_ViewToKeyMap,&Key->DSV,Key);
    }
    if (Key->ShadingRate != (VkImageView)0x0) {
      std::
      _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::_M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)&this->m_ViewToKeyMap,&Key->ShadingRate,Key);
    }
    for (uVar6 = 0; uVar6 < Key->NumRenderTargets; uVar6 = uVar6 + 1) {
      if (*ppVVar9 != (VkImageView)0x0) {
        std::
        _Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::_M_emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                  ((_Hashtable<VkImageView_T*,std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>,std::__detail::_Select1st,std::equal_to<VkImageView_T*>,std::hash<VkImageView_T*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)&this->m_ViewToKeyMap,ppVVar9,Key);
      }
      ppVVar9 = ppVVar9 + 1;
    }
    VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>
    ::~VulkanObjectWrapper(&Framebuffer);
  }
  else {
    pVVar10 = *(VkFramebuffer *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
                      ._M_cur + 0x88);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return pVVar10;
}

Assistant:

VkFramebuffer FramebufferCache::GetFramebuffer(const FramebufferCacheKey& Key, uint32_t width, uint32_t height, uint32_t layers)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto it = m_Cache.find(Key);
    if (it != m_Cache.end())
    {
        return it->second;
    }
    else
    {
        VkFramebufferCreateInfo FramebufferCI{};
        FramebufferCI.sType      = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        FramebufferCI.pNext      = nullptr;
        FramebufferCI.flags      = 0; // reserved for future use
        FramebufferCI.renderPass = Key.Pass;

        std::array<VkImageView, 2 + MAX_RENDER_TARGETS> Attachments;

        uint32_t& attachment = FramebufferCI.attachmentCount;
        if (Key.DSV != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.DSV;

        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                Attachments[attachment++] = Key.RTVs[rt];
        }

        if (Key.ShadingRate != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.ShadingRate;

        FramebufferCI.pAttachments = Attachments.data();
        FramebufferCI.width        = width;
        FramebufferCI.height       = height;
        FramebufferCI.layers       = layers;

        VulkanUtilities::FramebufferWrapper Framebuffer = m_DeviceVk.GetLogicalDevice().CreateFramebuffer(FramebufferCI);

        VkFramebuffer fb = Framebuffer;

        auto new_it = m_Cache.insert(std::make_pair(Key, std::move(Framebuffer)));
        VERIFY(new_it.second, "New framebuffer must be inserted into the map");
        (void)new_it;

        m_RenderPassToKeyMap.emplace(Key.Pass, Key);
        if (Key.DSV != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.DSV, Key);
        if (Key.ShadingRate != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.ShadingRate, Key);
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                m_ViewToKeyMap.emplace(Key.RTVs[rt], Key);

        return fb;
    }
}